

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O0

void pathSeparator(char *sep)

{
  char *sep_local;
  
  if (sep != (char *)0x0) {
    *sep = '/';
  }
  return;
}

Assistant:

void pathSeparator(char * sep)
{
    if (sep != 0x0)
    {
#ifdef SYSTEM_WINDOWS
        *sep = '\\';
#else
        *sep = '/';
#endif
    }
}